

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_executor.cpp
# Opt level: O3

void __thiscall
duckdb::PipelineExecutor::GoToSource(PipelineExecutor *this,idx_t *current_idx,idx_t initial_idx)

{
  _Elt_pointer puVar1;
  
  *current_idx = initial_idx;
  puVar1 = (this->in_process_operators).c.
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (puVar1 != (this->in_process_operators).c.
                super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur) {
    if (puVar1 == (this->in_process_operators).c.
                  super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      puVar1 = (this->in_process_operators).c.
               super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    *current_idx = puVar1[-1];
    ::std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
              (&(this->in_process_operators).c);
    return;
  }
  return;
}

Assistant:

void PipelineExecutor::GoToSource(idx_t &current_idx, idx_t initial_idx) {
	// we go back to the first operator (the source)
	current_idx = initial_idx;
	if (!in_process_operators.empty()) {
		// ... UNLESS there is an in process operator
		// if there is an in-process operator, we start executing at the latest one
		// for example, if we have a join operator that has tuples left, we first need to emit those tuples
		current_idx = in_process_operators.top();
		in_process_operators.pop();
	}
	D_ASSERT(current_idx >= initial_idx);
}